

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

void gdImageString16(gdImagePtr im,gdFontPtr f,int x,int y,unsigned_short *s,int color)

{
  int iVar1;
  int local_30;
  int l;
  int i;
  int color_local;
  unsigned_short *s_local;
  int y_local;
  int x_local;
  gdFontPtr f_local;
  gdImagePtr im_local;
  
  iVar1 = strlen16(s);
  s_local._4_4_ = x;
  for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
    gdImageChar(im,f,s_local._4_4_,y,(uint)s[local_30],color);
    s_local._4_4_ = f->w + s_local._4_4_;
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageString16 (gdImagePtr im, gdFontPtr f,
								   int x, int y, unsigned short *s, int color)
{
	int i;
	int l;
	l = strlen16 (s);
	for (i = 0; (i < l); i++) {
		gdImageChar (im, f, x, y, s[i], color);
		x += f->w;
	}
}